

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddVisibilityPresetFlags
          (cmLocalGenerator *this,string *flags,cmTarget *target,string *lang)

{
  bool bVar1;
  TargetType TVar2;
  PolicyStatus PVar3;
  uint uVar4;
  ulong uVar5;
  ostream *poVar6;
  string *psVar7;
  char *pcVar8;
  cmMakefile *this_00;
  cmake *this_01;
  cmListFileBacktrace *bt;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmTarget_*>,_bool> pVar9;
  byte local_252;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  ostringstream w;
  string *local_50;
  string *pWarnCMP0063;
  string warnCMP0063;
  string *lang_local;
  cmTarget *target_local;
  string *flags_local;
  cmLocalGenerator *this_local;
  
  warnCMP0063.field_2._8_8_ = lang;
  lang_local = (string *)target;
  target_local = (cmTarget *)flags;
  flags_local = (string *)this;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    return;
  }
  std::__cxx11::string::string((string *)&pWarnCMP0063);
  local_50 = (string *)0x0;
  TVar2 = cmTarget::GetType((cmTarget *)lang_local);
  if (((TVar2 != SHARED_LIBRARY) &&
      (TVar2 = cmTarget::GetType((cmTarget *)lang_local), TVar2 != MODULE_LIBRARY)) &&
     (bVar1 = cmTarget::IsExecutableWithExports((cmTarget *)lang_local), !bVar1)) {
    PVar3 = cmTarget::GetPolicyStatusCMP0063((cmTarget *)lang_local);
    if (PVar3 == OLD) goto LAB_00604829;
    if (PVar3 == WARN) {
      local_50 = (string *)&pWarnCMP0063;
    }
  }
  AddVisibilityCompileOption
            ((string *)target_local,(cmTarget *)lang_local,this,(string *)warnCMP0063.field_2._8_8_,
             local_50);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          warnCMP0063.field_2._8_8_,"CXX");
  if (bVar1) {
    AddInlineVisibilityCompileOption((string *)target_local,(cmTarget *)lang_local,this,local_50);
  }
  uVar4 = std::__cxx11::string::empty();
  local_252 = 0;
  if ((uVar4 & 1) == 0) {
    pVar9 = std::
            set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::
            insert(&this->WarnCMP0063,(value_type *)&lang_local);
    local_252 = pVar9.second;
  }
  if ((local_252 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_218,(cmPolicies *)0x3f,id);
    poVar6 = std::operator<<((ostream *)local_1f8,(string *)&local_218);
    poVar6 = std::operator<<(poVar6,"\nTarget \"");
    psVar7 = cmTarget::GetName_abi_cxx11_((cmTarget *)lang_local);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    poVar6 = std::operator<<(poVar6,"\" of type \"");
    TVar2 = cmTarget::GetType((cmTarget *)lang_local);
    pcVar8 = cmTarget::GetTargetTypeName(TVar2);
    poVar6 = std::operator<<(poVar6,pcVar8);
    poVar6 = std::operator<<(poVar6,"\" has the following visibility properties set for ");
    poVar6 = std::operator<<(poVar6,(string *)warnCMP0063.field_2._8_8_);
    poVar6 = std::operator<<(poVar6,":\n");
    poVar6 = std::operator<<(poVar6,(string *)&pWarnCMP0063);
    std::operator<<(poVar6,"For compatibility CMake is not honoring them for this target.");
    std::__cxx11::string::~string((string *)&local_218);
    this_00 = cmTarget::GetMakefile((cmTarget *)lang_local);
    this_01 = cmMakefile::GetCMakeInstance(this_00);
    std::__cxx11::ostringstream::str();
    bt = cmTarget::GetBacktrace((cmTarget *)lang_local);
    cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_238,bt);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  }
LAB_00604829:
  std::__cxx11::string::~string((string *)&pWarnCMP0063);
  return;
}

Assistant:

void cmLocalGenerator
::AddVisibilityPresetFlags(std::string &flags, cmTarget const* target,
                            const std::string& lang)
{
  if (lang.empty())
    {
    return;
    }

  std::string warnCMP0063;
  std::string *pWarnCMP0063 = 0;
  if (target->GetType() != cmTarget::SHARED_LIBRARY &&
      target->GetType() != cmTarget::MODULE_LIBRARY &&
      !target->IsExecutableWithExports())
    {
    switch (target->GetPolicyStatusCMP0063())
      {
      case cmPolicies::OLD:
        return;
      case cmPolicies::WARN:
        pWarnCMP0063 = &warnCMP0063;
        break;
      default:
        break;
      }
    }

  AddVisibilityCompileOption(flags, target, this, lang, pWarnCMP0063);

  if(lang == "CXX")
    {
    AddInlineVisibilityCompileOption(flags, target, this, pWarnCMP0063);
    }

  if (!warnCMP0063.empty() &&
      this->WarnCMP0063.insert(target).second)
    {
    std::ostringstream w;
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0063) << "\n"
      "Target \"" << target->GetName() << "\" of "
      "type \"" << cmTarget::GetTargetTypeName(target->GetType()) << "\" "
      "has the following visibility properties set for " << lang << ":\n" <<
      warnCMP0063 <<
      "For compatibility CMake is not honoring them for this target.";
    target->GetMakefile()->GetCMakeInstance()
      ->IssueMessage(cmake::AUTHOR_WARNING, w.str(), target->GetBacktrace());
    }
}